

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int saveCursorPosition(BtCursor *pCur)

{
  int rc;
  BtCursor *pCur_local;
  
  if ((pCur->curFlags & 0x40) == 0) {
    if (pCur->eState == '\x02') {
      pCur->eState = '\0';
    }
    else {
      pCur->skipNext = 0;
    }
    pCur_local._4_4_ = saveCursorKey(pCur);
    if (pCur_local._4_4_ == 0) {
      btreeReleaseAllCursorPages(pCur);
      pCur->eState = '\x03';
    }
    pCur->curFlags = pCur->curFlags & 0xf1;
  }
  else {
    pCur_local._4_4_ = 0xb13;
  }
  return pCur_local._4_4_;
}

Assistant:

static int saveCursorPosition(BtCursor *pCur){
  int rc;

  assert( CURSOR_VALID==pCur->eState || CURSOR_SKIPNEXT==pCur->eState );
  assert( 0==pCur->pKey );
  assert( cursorHoldsMutex(pCur) );

  if( pCur->curFlags & BTCF_Pinned ){
    return SQLITE_CONSTRAINT_PINNED;
  }
  if( pCur->eState==CURSOR_SKIPNEXT ){
    pCur->eState = CURSOR_VALID;
  }else{
    pCur->skipNext = 0;
  }

  rc = saveCursorKey(pCur);
  if( rc==SQLITE_OK ){
    btreeReleaseAllCursorPages(pCur);
    pCur->eState = CURSOR_REQUIRESEEK;
  }

  pCur->curFlags &= ~(BTCF_ValidNKey|BTCF_ValidOvfl|BTCF_AtLast);
  return rc;
}